

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O3

base_learner * confidence_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  option_group_definition *this;
  confidence *pcVar2;
  base_learner *l;
  single_learner *__src;
  learner<confidence,_example> *__dest;
  code *pcVar3;
  code *pcVar4;
  bool confidence_after_training;
  bool confidence_arg;
  size_type __dnew_2;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  bool local_252;
  bool local_251;
  long local_250;
  long *local_248;
  long local_240;
  long local_238 [2];
  _func_int ***local_228;
  _func_int **local_220;
  _func_int **local_218 [2];
  option_group_definition local_208;
  string local_1d0;
  string local_1b0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined2 local_178;
  undefined1 local_176;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_251 = false;
  local_252 = false;
  local_180 = 0x6e656469666e6f43;
  local_178 = 0x6563;
  local_188 = 10;
  local_176 = 0;
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,&local_180);
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  local_1b0.field_2._M_allocated_capacity = 0x6e656469666e6f63;
  local_1b0.field_2._8_2_ = 0x6563;
  local_1b0._M_string_length = 10;
  local_1b0.field_2._M_local_buf[10] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_d0,&local_1b0,&local_251)
  ;
  local_60 = true;
  local_228 = local_218;
  local_170._0_8_ = (_func_int **)0x25;
  local_228 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)local_170);
  local_218[0] = (_func_int **)local_170._0_8_;
  local_228[2] = (_func_int **)0x72616e696220726f;
  local_228[3] = (_func_int **)0x6369646572702079;
  *local_228 = (_func_int **)0x666e6f6320746547;
  local_228[1] = (_func_int **)0x662065636e656469;
  builtin_strncpy((char *)((long)local_228 + 0x1d),"dictions",8);
  local_220 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_228 + local_170._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&local_208,(typed_option<bool> *)local_d0);
  local_248 = (long *)0x19;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_248);
  local_1d0.field_2._M_allocated_capacity = (size_type)local_248;
  builtin_strncpy(local_1d0._M_dataplus._M_p,"confidence_after_training",0x19);
  local_1d0._M_string_length = (size_type)local_248;
  local_1d0._M_dataplus._M_p[(long)local_248] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_1d0,&local_252);
  local_250 = 0x19;
  local_248 = local_238;
  local_248 = (long *)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_250);
  local_238[0] = local_250;
  builtin_strncpy((char *)((long)local_248 + 9),"e after ",8);
  builtin_strncpy((char *)((long)local_248 + 0x11),"training",8);
  *local_248 = 0x6e656469666e6f43;
  local_248[1] = 0x7265746661206563;
  local_240 = local_250;
  *(char *)((long)local_248 + local_250) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (this,(typed_option<bool> *)local_170);
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  local_170._0_8_ = &PTR__typed_option_002dc108;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  local_d0._0_8_ = &PTR__typed_option_002dc108;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_208);
  if (local_251 != false) {
    if (all->training != false) {
      pcVar2 = calloc_or_throw<confidence>(1);
      pcVar2->all = all;
      pcVar3 = predict_or_learn_with_confidence<true,false>;
      if (local_252 != false) {
        pcVar3 = predict_or_learn_with_confidence<true,true>;
      }
      pcVar4 = predict_or_learn_with_confidence<false,false>;
      if (local_252 != false) {
        pcVar4 = predict_or_learn_with_confidence<false,true>;
      }
      l = setup_base(options,all);
      __src = LEARNER::as_singleline<char,char>(l);
      uVar1 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<confidence,example>>(1);
      memcpy(__dest,__src,0xe9);
      *(single_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(confidence **)(__dest + 0xb8) = pcVar2;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(undefined8 *)(__dest + 0xd8) = 1;
      *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
      *(confidence **)(__dest + 0x18) = pcVar2;
      *(code **)(__dest + 0x28) = pcVar3;
      *(code **)(__dest + 0x38) = pcVar3;
      *(code **)(__dest + 0x30) = pcVar4;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar1;
      __dest[0xe8] = (learner<confidence,_example>)0x0;
      *(confidence **)(__dest + 0x58) = pcVar2;
      *(code **)(__dest + 0x68) = return_confidence_example;
      goto LAB_001e391c;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when saving the model and avoid --test_only"
               ,0x90);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  __dest = (learner<confidence,_example> *)0x0;
LAB_001e391c:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* confidence_setup(options_i& options, vw& all)
{
  bool confidence_arg = false;
  bool confidence_after_training = false;
  option_group_definition new_options("Confidence");
  new_options.add(make_option("confidence", confidence_arg).keep().help("Get confidence for binary predictions"))
      .add(make_option("confidence_after_training", confidence_after_training).help("Confidence after training"));
  options.add_and_parse(new_options);

  if (!confidence_arg)
    return nullptr;

  if (!all.training)
  {
    cout << "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when "
            "saving the model and avoid --test_only"
         << endl;
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<confidence>();
  data->all = &all;

  void (*learn_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;
  void (*predict_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;

  if (confidence_after_training)
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, true>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, true>;
  }
  else
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, false>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, false>;
  }

  // Create new learner
  learner<confidence, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), learn_with_confidence_ptr, predict_with_confidence_ptr);

  l.set_finish_example(return_confidence_example);

  return make_base(l);
}